

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

Text __thiscall loguru::ec_to_text(loguru *this,char c)

{
  long *plVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  string str;
  long *local_40 [2];
  long local_30 [2];
  
  uVar4 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\'","");
  iVar3 = (int)CONCAT71(in_register_00000031,c);
  if (iVar3 < 0x22) {
    switch(uVar4) {
    case 0:
      break;
    default:
switchD_0013b2d0_caseD_1:
      if ((byte)uVar4 < 0x20) {
        std::__cxx11::string::append((char *)local_40);
        std::__cxx11::string::push_back((char)local_40);
        std::__cxx11::string::push_back((char)local_40);
        std::__cxx11::string::push_back((char)local_40);
      }
      std::__cxx11::string::push_back((char)local_40);
      goto LAB_0013b33e;
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xc:
      break;
    case 0xd:
    }
  }
  else if (((iVar3 != 0x22) && (iVar3 != 0x27)) && (iVar3 != 0x5c)) goto switchD_0013b2d0_caseD_1;
  std::__cxx11::string::append((char *)local_40);
LAB_0013b33e:
  std::__cxx11::string::append((char *)local_40);
  plVar1 = local_40[0];
  pcVar2 = strdup((char *)local_40[0]);
  *(char **)this = pcVar2;
  if (plVar1 != local_30) {
    operator_delete(plVar1,local_30[0] + 1);
  }
  return (Text)(char *)this;
}

Assistant:

Text ec_to_text(char c)
	{
		// Add quotes around the character to make it obvious where it begin and ends.
		std::string str = "'";

		auto write_hex_digit = [&](unsigned num)
		{
			if (num < 10u) { str += char('0' + num); }
			else           { str += char('a' + num - 10); }
		};

		auto write_hex_16 = [&](uint16_t n)
		{
			write_hex_digit((n >> 12u) & 0x0f);
			write_hex_digit((n >>  8u) & 0x0f);
			write_hex_digit((n >>  4u) & 0x0f);
			write_hex_digit((n >>  0u) & 0x0f);
		};

		if      (c == '\\') { str += "\\\\"; }
		else if (c == '\"') { str += "\\\""; }
		else if (c == '\'') { str += "\\\'"; }
		else if (c == '\0') { str += "\\0";  }
		else if (c == '\b') { str += "\\b";  }
		else if (c == '\f') { str += "\\f";  }
		else if (c == '\n') { str += "\\n";  }
		else if (c == '\r') { str += "\\r";  }
		else if (c == '\t') { str += "\\t";  }
		else if (0 <= c && c < 0x20) {
			str += "\\u";
			write_hex_16(static_cast<uint16_t>(c));
		} else { str += c; }

		str += "'";

		return Text{STRDUP(str.c_str())};
	}